

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::deinit
          (OperatorPerformanceCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar4;
  reference pvVar5;
  OperatorPerformanceCase *this_local;
  
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_attribBuffers);
  if (!bVar2) {
    iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x438);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_attribBuffers);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_attribBuffers,0);
    (*pcVar1)(sVar4 & 0xffffffff,pvVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_attribBuffers);
  }
  std::
  vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>::
  clear(&this->m_programs);
  return;
}

Assistant:

void OperatorPerformanceCase::deinit (void)
{
	if (!m_attribBuffers.empty())
	{
		m_renderCtx.getFunctions().deleteBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
		m_attribBuffers.clear();
	}

	m_programs.clear();
}